

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O3

_Bool upb_MiniTable_SetSubEnum
                (upb_MiniTable *table,upb_MiniTableField *field,upb_MiniTableEnum *sub)

{
  uint8_t uVar1;
  
  if ((table->fields_dont_copy_me__upb_internal_use_only <= field) &&
     (field < table->fields_dont_copy_me__upb_internal_use_only +
              table->field_count_dont_copy_me__upb_internal_use_only)) {
    if (sub != (upb_MiniTableEnum *)0x0) {
      uVar1 = field->descriptortype_dont_copy_me__upb_internal_use_only;
      if (uVar1 == '\x0e') {
        table->subs_dont_copy_me__upb_internal_use_only
        [field->submsg_index_dont_copy_me__upb_internal_use_only].
        subenum_dont_copy_me__upb_internal_use_only = sub;
      }
      return uVar1 == '\x0e';
    }
    __assert_fail("sub",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/link.c"
                  ,0x47,
                  "_Bool upb_MiniTable_SetSubEnum(upb_MiniTable *, upb_MiniTableField *, const upb_MiniTableEnum *)"
                 );
  }
  __assert_fail("(uintptr_t)table->fields_dont_copy_me__upb_internal_use_only <= (uintptr_t)field && (uintptr_t)field < (uintptr_t)(table->fields_dont_copy_me__upb_internal_use_only + table->field_count_dont_copy_me__upb_internal_use_only)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/link.c"
                ,0x46,
                "_Bool upb_MiniTable_SetSubEnum(upb_MiniTable *, upb_MiniTableField *, const upb_MiniTableEnum *)"
               );
}

Assistant:

bool upb_MiniTable_SetSubEnum(upb_MiniTable* table, upb_MiniTableField* field,
                              const upb_MiniTableEnum* sub) {
  UPB_ASSERT((uintptr_t)table->UPB_PRIVATE(fields) <= (uintptr_t)field &&
             (uintptr_t)field < (uintptr_t)(table->UPB_PRIVATE(fields) +
                                            table->UPB_PRIVATE(field_count)));
  UPB_ASSERT(sub);

  if (field->UPB_PRIVATE(descriptortype) != kUpb_FieldType_Enum) {
    return false;
  }

  upb_MiniTableSub* table_sub =
      (void*)&table->UPB_PRIVATE(subs)[field->UPB_PRIVATE(submsg_index)];
  *table_sub = upb_MiniTableSub_FromEnum(sub);
  return true;
}